

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

double __thiscall
helics::RandomDelayFilterOperation::getProperty
          (RandomDelayFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar2;
  pointer pRVar3;
  char *in_RDX;
  char *in_RSI;
  FilterOperations *in_RDI;
  double dVar4;
  char *in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *pcVar5;
  size_t in_stack_fffffffffffffef8;
  char *pcVar6;
  char *in_stack_ffffffffffffff00;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  __x._M_str = in_stack_ffffffffffffff00;
  __x._M_len = in_stack_fffffffffffffef8;
  __y._M_str = in_stack_fffffffffffffef0;
  __y._M_len = in_stack_fffffffffffffee8;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    __x_00._M_str = in_stack_ffffffffffffff00;
    __x_00._M_len = in_stack_fffffffffffffef8;
    __y_00._M_str = in_stack_fffffffffffffef0;
    __y_00._M_len = in_stack_fffffffffffffee8;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      __x_01._M_str = in_stack_ffffffffffffff00;
      __x_01._M_len = in_stack_fffffffffffffef8;
      __y_01._M_str = in_stack_fffffffffffffef0;
      __y_01._M_len = in_stack_fffffffffffffee8;
      bVar2 = std::operator==(__x_01,__y_01);
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        __x_02._M_str = in_stack_ffffffffffffff00;
        __x_02._M_len = in_stack_fffffffffffffef8;
        __y_02._M_str = in_stack_fffffffffffffef0;
        __y_02._M_len = in_stack_fffffffffffffee8;
        bVar2 = std::operator==(__x_02,__y_02);
        if (!bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          __x_03._M_str = in_stack_ffffffffffffff00;
          __x_03._M_len = in_stack_fffffffffffffef8;
          __y_03._M_str = in_stack_fffffffffffffef0;
          __y_03._M_len = in_stack_fffffffffffffee8;
          bVar2 = std::operator==(__x_03,__y_03);
          if (!bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            __x_04._M_str = in_stack_ffffffffffffff00;
            __x_04._M_len = in_stack_fffffffffffffef8;
            __y_04._M_str = in_stack_fffffffffffffef0;
            __y_04._M_len = in_stack_fffffffffffffee8;
            bVar2 = std::operator==(__x_04,__y_04);
            if (!bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
              __x_05._M_str = in_stack_ffffffffffffff00;
              __x_05._M_len = in_stack_fffffffffffffef8;
              __y_05._M_str = in_stack_fffffffffffffef0;
              __y_05._M_len = in_stack_fffffffffffffee8;
              bVar2 = std::operator==(__x_05,__y_05);
              if (!bVar2) {
                pcVar5 = in_RSI;
                pcVar6 = in_RDX;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
                __x_06._M_str = in_stack_ffffffffffffff00;
                __x_06._M_len = (size_t)pcVar6;
                __y_06._M_str = pcVar5;
                __y_06._M_len = in_stack_fffffffffffffee8;
                bVar2 = std::operator==(__x_06,__y_06);
                if (!bVar2) {
                  sVar1._M_str = in_RDX;
                  sVar1._M_len = (size_t)in_RSI;
                  dVar4 = FilterOperations::getProperty(in_RDI,sVar1);
                  return dVar4;
                }
              }
            }
          }
          pRVar3 = std::
                   unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                   ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                                 *)0x2d8c2b);
          dVar4 = std::__atomic_float<double>::load
                            (&(pRVar3->param2).super___atomic_float<double>,seq_cst);
          return dVar4;
        }
      }
    }
  }
  pRVar3 = std::
           unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
           ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                         *)0x2d8ac6);
  dVar4 = std::__atomic_float<double>::load(&(pRVar3->param1).super___atomic_float<double>,seq_cst);
  return dVar4;
}

Assistant:

double RandomDelayFilterOperation::getProperty(std::string_view property)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        return (rdelayGen->param1.load());
    }
    if ((property == "param2") || (property == "stddev") || (property == "max") ||
        (property == "beta")) {
        return (rdelayGen->param2.load());
    }
    return FilterOperations::getProperty(property);
}